

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void __thiscall IR::Opnd::DumpOpndKindMemRef(Opnd *this,bool AsmDumpMode,Func *func)

{
  MemRefOpnd *pMVar1;
  char16 local_118 [4];
  char16 buffer [128];
  
  pMVar1 = AsMemRefOpnd(this);
  Output::Print(L"[");
  GetAddrDescription(local_118,0x80,(void *)pMVar1->m_memLoc,pMVar1->m_addrKind,false,true,func,
                     false);
  Output::Print(L"%s",local_118);
  Output::Print(L"]");
  return;
}

Assistant:

void
Opnd::DumpOpndKindMemRef(bool AsmDumpMode, Func *func)
{
    MemRefOpnd *memRefOpnd = this->AsMemRefOpnd();
    Output::Print(_u("["));
    const size_t BUFFER_LEN = 128;
    char16 buffer[BUFFER_LEN];
    // TODO: michhol, make this intptr_t
    GetAddrDescription(buffer, BUFFER_LEN, (void*)memRefOpnd->GetMemLoc(), memRefOpnd->GetAddrKind(), AsmDumpMode, true, func);
    Output::Print(_u("%s"), buffer);
    Output::Print(_u("]"));
}